

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist.hpp
# Opt level: O2

vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
mnist::read_images(vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                   *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  runtime_error *this;
  vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> images_u8;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&images_u8,filename,auto_format);
  bVar1 = pico_tree::std::filesystem::exists((path *)&images_u8);
  pico_tree::std::filesystem::__cxx11::path::~path((path *)&images_u8);
  if (bVar1) {
    images_u8.
    super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    images_u8.
    super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    images_u8.
    super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pico_tree::read_mnist_images(filename,&images_u8);
    cast<float,std::byte,784ul>(__return_storage_ptr__,&images_u8);
    pico_tree::std::
    _Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::
    ~_Vector_base(&images_u8.
                   super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                 );
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&images_u8,
                 filename," doesn\'t exist");
  std::runtime_error::runtime_error(this,(string *)&images_u8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::vector<image_float> read_images(std::string const& filename) {
    if (!std::filesystem::exists(filename)) {
      throw std::runtime_error(filename + " doesn't exist");
    }

    std::vector<image_byte> images_u8;
    pico_tree::read_mnist_images(filename, images_u8);
    return cast<scalar_type>(images_u8);
  }